

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O2

void mp::WriteJSON<mp::QuadAndLinTerms,mp::AlgConRhs<1>>
               (JSONW *jw,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *algc)

{
  string_view key;
  string_view key_00;
  AlgConRhs<1> local_40;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_38;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_28;
  
  key._M_str = (char *)0x4;
  key._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_28,key);
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,mp::QuadAndLinTerms>
            (&local_28,&algc->super_QuadAndLinTerms);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&local_28);
  key_00._M_str = (char *)0xc;
  key_00._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_38,key_00)
  ;
  local_40.rhs_ = (algc->super_AlgConRhs<1>).rhs_;
  WriteJSON<1>(&local_38,&local_40);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&local_38);
  return;
}

Assistant:

inline void WriteJSON(JSONW jw,
                      const AlgebraicConstraint<Body, RhsOrRange>& algc) {
  WriteJSON(jw["body"], algc.GetBody());
  WriteJSON(jw["rhs_or_range"], algc.GetRhsOrRange());
}